

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

void __thiscall cppcms::crypto::key::set_hex(key *this,char *ptr,size_t len)

{
  uint uVar1;
  uint uVar2;
  invalid_argument *this_00;
  undefined8 uVar3;
  void *pvVar4;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  uint b;
  uint h;
  char c;
  uint i;
  key *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  string *s;
  invalid_argument *in_stack_ffffffffffffff60;
  uint local_84;
  uint local_80;
  undefined1 local_79 [36];
  char local_55;
  uint local_54;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  reset(in_stack_ffffffffffffff50);
  if (local_18 != 0) {
    if ((local_18 & 1) != 0) {
      local_4d = 1;
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_38,"cppcms::crypto::key: the hexadecimal key length is not multiple of 2",
                 &local_39);
      booster::invalid_argument::invalid_argument(this_00,in_stack_ffffffffffffff58);
      local_4d = 0;
      __cxa_throw(this_00,&booster::invalid_argument::typeinfo,
                  booster::invalid_argument::~invalid_argument);
    }
    for (local_54 = 0; local_54 < local_18; local_54 = local_54 + 1) {
      local_55 = *(char *)(local_10 + (ulong)local_54);
      if ((((local_55 < '0') || ('9' < local_55)) && ((local_55 < 'a' || ('f' < local_55)))) &&
         ((local_55 < 'A' || ('F' < local_55)))) {
        uVar3 = __cxa_allocate_exception(0x30);
        s = (string *)local_79;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_79 + 1),
                   "cppcms::crypto::key: the hexadecimal key has invalid characters",(allocator *)s)
        ;
        booster::invalid_argument::invalid_argument(in_stack_ffffffffffffff60,s);
        __cxa_throw(uVar3,&booster::invalid_argument::typeinfo,
                    booster::invalid_argument::~invalid_argument);
      }
    }
    in_RDI[1] = local_18 >> 1;
    pvVar4 = operator_new__(in_RDI[1]);
    *in_RDI = (long)pvVar4;
    local_84 = 0;
    for (local_80 = 0; local_80 < local_18; local_80 = local_80 + 2) {
      uVar1 = from_hex(*(char *)(local_10 + (ulong)local_80));
      uVar2 = from_hex(*(char *)(local_10 + (ulong)(local_80 + 1)));
      *(char *)(*in_RDI + (ulong)local_84) = (char)(uVar1 << 4) + (char)uVar2;
      local_84 = local_84 + 1;
    }
  }
  return;
}

Assistant:

void key::set_hex(char const *ptr,size_t len)
	{
		reset();
		if(len == 0)
			return;
		if(len % 2 != 0) {
			throw booster::invalid_argument("cppcms::crypto::key: the hexadecimal key length is not multiple of 2");
		}
		for(unsigned i=0;i<len;i++) {
			char c=ptr[i];
			if(	('0'<=c && c<='9')
				|| ('a' <= c && c<='f')
				|| ('A' <= c && c<='F')
			  )
			{
				continue;
			}
			throw booster::invalid_argument("cppcms::crypto::key: the hexadecimal key has invalid characters");
		}
		size_ = len / 2;
		data_ = new char[size_];
		for(unsigned h=0,b=0;h<len;h+=2,b++) {
			data_[b] = (from_hex(ptr[h]) << 4) + from_hex(ptr[h+1]);
		}
	}